

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.h
# Opt level: O1

bool comparesEqual(QRectF *r1,QRect *r2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QSizeF local_48;
  QPointF local_38;
  QSizeF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.xp = r1->xp;
  local_38.yp = r1->yp;
  uVar1 = r2->x1;
  uVar4 = r2->y1;
  local_28.wd = (qreal)(int)uVar1;
  local_28.ht = (qreal)(int)uVar4;
  bVar7 = qFuzzyCompare(&local_38,(QPointF *)&local_28);
  if (bVar7) {
    local_48.wd = r1->w;
    local_48.ht = r1->h;
    uVar2 = r2->x2;
    uVar5 = r2->y2;
    uVar3 = r2->x1;
    uVar6 = r2->y1;
    local_28.wd = (qreal)((uVar2 - uVar3) + 1);
    local_28.ht = (qreal)((uVar5 - uVar6) + 1);
    bVar7 = qFuzzyCompare(&local_48,&local_28);
  }
  else {
    bVar7 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

constexpr bool comparesEqual(const QRectF &r1, const QRect &r2) noexcept
    { return r1.topLeft() == r2.topLeft() && r1.size() == r2.size(); }